

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

void duckdb::BitpackingPrimitives::UnPackGroup<short>
               (data_ptr_t dst,data_ptr_t src,bitpacking_width_t width,bool skip_sign_extension)

{
  byte bVar1;
  byte in_CL;
  byte in_DL;
  uint16_t *in_RSI;
  undefined8 in_RDI;
  bitpacking_width_t width_00;
  undefined6 unaff_retaddr;
  undefined6 in_stack_ffffffffffffffe8;
  
  width_00 = (bitpacking_width_t)((ulong)in_RDI >> 0x38);
  bVar1 = in_CL & 1;
  duckdb_fastpforlib::fastunpack
            (in_RSI,(uint16_t *)
                    (CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffe8)) & 0xff01ffffffffffff)
             ,0);
  if ((((bVar1 & 1) == 0) && (in_DL != 0)) && (in_DL < 0x10)) {
    SignExtend<short,unsigned_short>
              ((data_ptr_t)CONCAT17(width,CONCAT16(skip_sign_extension,unaff_retaddr)),width_00);
  }
  return;
}

Assistant:

static inline void UnPackGroup(data_ptr_t dst, data_ptr_t src, bitpacking_width_t width,
	                               bool skip_sign_extension = false) {
		if (std::is_same<T, int8_t>::value || std::is_same<T, uint8_t>::value) {
			duckdb_fastpforlib::fastunpack(reinterpret_cast<const uint8_t *>(src), reinterpret_cast<uint8_t *>(dst),
			                               static_cast<uint32_t>(width));
		} else if (std::is_same<T, int16_t>::value || std::is_same<T, uint16_t>::value) {
			duckdb_fastpforlib::fastunpack(reinterpret_cast<const uint16_t *>(src), reinterpret_cast<uint16_t *>(dst),
			                               static_cast<uint32_t>(width));
		} else if (std::is_same<T, int32_t>::value || std::is_same<T, uint32_t>::value) {
			duckdb_fastpforlib::fastunpack(reinterpret_cast<const uint32_t *>(src), reinterpret_cast<uint32_t *>(dst),
			                               static_cast<uint32_t>(width));
		} else if (std::is_same<T, int64_t>::value || std::is_same<T, uint64_t>::value) {
			duckdb_fastpforlib::fastunpack(reinterpret_cast<const uint32_t *>(src), reinterpret_cast<uint64_t *>(dst),
			                               static_cast<uint32_t>(width));
		} else if (std::is_same<T, hugeint_t>::value || std::is_same<T, uhugeint_t>::value) {
			HugeIntPacker::Unpack(reinterpret_cast<const uint32_t *>(src), reinterpret_cast<uhugeint_t *>(dst), width);
		} else {
			throw InternalException("Unsupported type for bitpacking");
		}

		if (NumericLimits<T>::IsSigned() && !skip_sign_extension && width > 0 && width < sizeof(T) * 8) {
			SignExtend<T>(dst, width);
		}
	}